

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::image::anon_unknown_0::LoadStoreTest::createInstance(LoadStoreTest *this,Context *context)

{
  Texture *texture;
  int *piVar1;
  VkFormat format;
  VkFormat VVar2;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data_00;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data_01;
  uint uVar3;
  LoadStoreTestInstance *this_00;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  Allocator *pAVar6;
  Buffer *this_01;
  Image *pIVar7;
  VkImageCreateFlags flags;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_c0;
  Texture *local_b0;
  LoadStoreTestInstance *local_a8;
  int *local_a0;
  LoadStoreTestInstance *local_98;
  int *local_90;
  VkImageCreateInfo local_88;
  
  if ((this->m_texture).m_type == IMAGE_TYPE_BUFFER) {
    this_00 = (LoadStoreTestInstance *)operator_new(0x128);
    uVar8 = 0;
    LoadStoreTestInstance::LoadStoreTestInstance
              (this_00,context,&this->m_texture,this->m_format,this->m_imageFormat,
               this->m_declareImageFormatInShader,false);
    (this_00->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__BufferLoadStoreTestInstance_00bd93e8;
    this_00[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    memset(&this_00[1].super_BaseTestInstance.m_texture,0,0xa0);
    pDVar4 = Context::getDeviceInterface
                       ((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    pVVar5 = Context::getDevice((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    pAVar6 = Context::getDefaultAllocator
                       ((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    this_01 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,this_00->m_imageSizeBytes,8);
    image::Buffer::Buffer
              (this_01,pDVar4,pVVar5,pAVar6,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_c0.m_data.ptr = (Buffer *)0x0;
    data.ptr._4_4_ = in_stack_ffffffffffffff2c;
    data.ptr._0_4_ = uVar8;
    data._8_8_ = in_stack_ffffffffffffff30;
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::assignData
              ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
               (this_00 + 1),data);
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
    ~UniqueBase(&local_c0);
  }
  else {
    this_00 = (LoadStoreTestInstance *)operator_new(0x120);
    uVar3 = (uint)this->m_singleLayerBind;
    LoadStoreTestInstance::LoadStoreTestInstance
              (this_00,context,&this->m_texture,this->m_format,this->m_imageFormat,
               this->m_declareImageFormatInShader,this->m_singleLayerBind);
    (this_00->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ImageLoadStoreTestInstance_00bd94e8;
    this_00[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    local_a8 = this_00 + 1;
    this_00[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_00[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    local_b0 = &this_00[1].super_BaseTestInstance.m_texture;
    piVar1 = this_00[1].m_referenceImage.m_size.m_data + 2;
    this_00[1].super_BaseTestInstance.m_texture.m_numLayers = 0;
    this_00[1].super_BaseTestInstance.m_texture.m_numSamples = 0;
    this_00[1].super_BaseTestInstance.m_format = VK_FORMAT_UNDEFINED;
    this_00[1].super_BaseTestInstance.m_declareImageFormatInShader = false;
    this_00[1].super_BaseTestInstance.m_singleLayerBind = false;
    *(undefined2 *)&this_00[1].super_BaseTestInstance.field_0x2e = 0;
    this_00[1].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[1].m_imageBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_00[1].m_imageSizeBytes = 0;
    *(undefined8 *)&this_00[1].m_imageFormat = 0;
    this_00[1].m_referenceImage.m_format.order = R;
    this_00[1].m_referenceImage.m_format.type = SNORM_INT8;
    this_00[1].m_referenceImage.m_size.m_data[0] = 0;
    this_00[1].m_referenceImage.m_size.m_data[1] = 0;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              *)piVar1,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    local_90 = piVar1;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)(this_00 + 2),(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    piVar1 = this_00[2].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2;
    local_98 = this_00 + 2;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)piVar1,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    local_a0 = piVar1;
    pDVar4 = Context::getDeviceInterface
                       ((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    pVVar5 = Context::getDevice((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    pAVar6 = Context::getDefaultAllocator
                       ((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    format = this_00->m_imageFormat;
    VVar2 = (this_00->super_BaseTestInstance).m_format;
    pIVar7 = (Image *)operator_new(0x30);
    flags = (uint)(VVar2 != format) << 3;
    texture = &(this_00->super_BaseTestInstance).m_texture;
    makeImageCreateInfo(&local_88,texture,format,10,flags);
    Image::Image(pIVar7,pDVar4,pVVar5,pAVar6,&local_88,(MemoryRequirement)0x0);
    local_c0.m_data.ptr = (Buffer *)0x0;
    data_00.ptr._4_4_ = in_stack_ffffffffffffff2c;
    data_00.ptr._0_4_ = uVar3;
    data_00._8_8_ = pVVar5;
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::assignData
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_a8,
               data_00);
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~UniqueBase
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_c0);
    pIVar7 = (Image *)operator_new(0x30);
    makeImageCreateInfo(&local_88,texture,this_00->m_imageFormat,9,flags);
    Image::Image(pIVar7,pDVar4,pVVar5,pAVar6,&local_88,(MemoryRequirement)0x0);
    local_c0.m_data.ptr = (Buffer *)0x0;
    data_01.ptr._4_4_ = in_stack_ffffffffffffff2c;
    data_01.ptr._0_4_ = uVar3;
    data_01._8_8_ = pVVar5;
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::assignData
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_b0,
               data_01);
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~UniqueBase
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_c0);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* LoadStoreTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferLoadStoreTestInstance(context, m_texture, m_format, m_imageFormat, m_declareImageFormatInShader);
	else
		return new ImageLoadStoreTestInstance(context, m_texture, m_format, m_imageFormat, m_declareImageFormatInShader, m_singleLayerBind);
}